

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_check_imports(lys_module *module,unres_schema *unres)

{
  byte size;
  byte size_00;
  lys_import *imp;
  char *pcVar1;
  char *pcVar2;
  lys_module *plVar3;
  lys_ext_instance **pplVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  lys_import *plVar9;
  lys_include *plVar10;
  char *pcVar11;
  char *pcVar12;
  LY_ERR *pLVar13;
  byte start;
  ulong uVar14;
  uint8_t start_00;
  ulong __nmemb;
  long lVar15;
  ulong uVar16;
  lys_import *inc;
  
  imp = module->imp;
  inc = (lys_import *)module->inc;
  size = module->imp_size;
  uVar16 = (ulong)size;
  size_00 = module->inc_size;
  __nmemb = (ulong)size_00;
  if (uVar16 == 0) {
LAB_00150c72:
    if (__nmemb != 0) {
      plVar10 = (lys_include *)calloc(__nmemb,0x30);
      module->inc = plVar10;
      module->inc_size = '\0';
      if (plVar10 == (lys_include *)0x0) goto LAB_00150e88;
    }
    if (size != 0) {
      start = 1;
      lVar15 = 0;
      do {
        pcVar1 = *(char **)(imp->rev + lVar15 + -0x10);
        pcVar2 = *(char **)(imp->rev + lVar15 + -8);
        pcVar12 = imp->rev + lVar15 + -0x10;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        if (pcVar2 == (char *)0x0) {
          ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"prefix","import");
LAB_00150ed6:
          free(pcVar1);
          lydict_remove(module->ctx,*(char **)(imp->rev + lVar15 + 0x18));
          lydict_remove(module->ctx,*(char **)(imp->rev + lVar15 + 0x20));
          lys_extension_instances_free
                    (module->ctx,*(lys_ext_instance ***)(imp->rev + lVar15 + 0x10),
                     (uint)(byte)imp->rev[lVar15 + 0xb]);
LAB_00150f12:
          start_00 = '\0';
          goto LAB_00150f4f;
        }
        plVar9 = module->imp + module->imp_size;
        iVar8 = lyp_check_identifier(pcVar2,LY_IDENT_PREFIX,module,(lys_node *)0x0);
        if (iVar8 != 0) goto LAB_00150ed6;
        pcVar11 = imp->rev + lVar15 + -0x10;
        plVar9->ref = *(char **)(pcVar11 + 0x30);
        plVar3 = *(lys_module **)pcVar11;
        pcVar12 = *(char **)(pcVar11 + 8);
        pplVar4 = *(lys_ext_instance ***)(pcVar11 + 0x10);
        pcVar2 = *(char **)(pcVar11 + 0x18);
        pcVar5 = *(char **)(pcVar11 + 0x28);
        plVar9->ext = *(lys_ext_instance ***)(pcVar11 + 0x20);
        plVar9->dsc = pcVar5;
        *(lys_ext_instance ***)plVar9->rev = pplVar4;
        *(char **)(plVar9->rev + 8) = pcVar2;
        plVar9->module = plVar3;
        plVar9->prefix = pcVar12;
        pcVar12 = lydict_insert_zc(module->ctx,pcVar1);
        iVar8 = lyp_check_import(module,pcVar12,plVar9);
        lydict_remove(module->ctx,pcVar12);
        module->imp_size = module->imp_size + '\x01';
        if (iVar8 != 0) goto LAB_00150f12;
        iVar8 = yang_check_ext_instance(module,&plVar9->ext,(uint)plVar9->ext_size,plVar9,unres);
        if (iVar8 != 0) {
          start_00 = '\0';
          goto LAB_00150f4f;
        }
        start = start + 1;
        lVar15 = lVar15 + 0x38;
      } while (uVar16 * 0x38 != lVar15);
    }
    if (__nmemb != 0) {
      uVar16 = 0;
      plVar9 = inc;
      do {
        plVar3 = plVar9->module;
        plVar9->module = (lys_module *)0x0;
        pcVar12 = lydict_insert_zc(module->ctx,(char *)plVar3);
        iVar8 = lyp_check_include(module,pcVar12,(lys_include *)plVar9,unres);
        if (iVar8 == 0) {
          plVar10 = module->inc;
          uVar14 = (ulong)((uint)module->inc_size * 0x30);
          plVar3 = plVar9->module;
          pcVar1 = plVar9->prefix;
          uVar6 = *(undefined8 *)plVar9->rev;
          uVar7 = *(undefined8 *)(plVar9->rev + 8);
          pcVar2 = plVar9->dsc;
          *(lys_ext_instance ***)(plVar10->rev + uVar14 + 0x18) = plVar9->ext;
          *(char **)(plVar10->rev + uVar14 + 0x18 + 8) = pcVar2;
          *(undefined8 *)(plVar10->rev + uVar14 + 8) = uVar6;
          *(undefined8 *)(plVar10->rev + uVar14 + 8 + 8) = uVar7;
          *(lys_module **)(plVar10->rev + (uVar14 - 8)) = plVar3;
          *(char **)(plVar10->rev + (uVar14 - 8) + 8) = pcVar1;
          plVar10 = module->inc;
          uVar14 = (ulong)((uint)module->inc_size * 0x30);
          iVar8 = yang_check_ext_instance
                            (module,(lys_ext_instance ***)(plVar10->rev + uVar14 + 0x10),
                             (uint)(byte)plVar10->rev[uVar14 + 0xb],plVar10->rev + (uVar14 - 8),
                             unres);
          module->inc_size = module->inc_size + '\x01';
          lydict_remove(module->ctx,pcVar12);
          if (iVar8 != 0) goto LAB_00150f46;
        }
        else {
          if (iVar8 == -1) {
            lys_extension_instances_free
                      (module->ctx,*(lys_ext_instance ***)(plVar9->rev + 8),
                       (uint)(byte)plVar9->rev[3]);
            lydict_remove(module->ctx,pcVar12);
LAB_00150f46:
            start_00 = (char)uVar16 + '\x01';
            start = size;
            goto LAB_00150f4f;
          }
          lydict_remove(module->ctx,pcVar12);
        }
        uVar16 = uVar16 + 1;
        plVar9 = (lys_import *)&plVar9->ref;
      } while (__nmemb != uVar16);
    }
    iVar8 = 0;
    plVar9 = inc;
    inc = imp;
  }
  else {
    plVar9 = (lys_import *)calloc(uVar16,0x38);
    module->imp = plVar9;
    module->imp_size = '\0';
    if (plVar9 != (lys_import *)0x0) goto LAB_00150c72;
LAB_00150e88:
    pLVar13 = ly_errno_location();
    *pLVar13 = LY_EMEM;
    start_00 = '\0';
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_imports");
    start = 0;
LAB_00150f4f:
    yang_free_import(module->ctx,imp,start,size);
    yang_free_include(module->ctx,(lys_include *)inc,start_00,size_00);
    iVar8 = 1;
    plVar9 = imp;
  }
  free(plVar9);
  free(inc);
  return iVar8;
}

Assistant:

int
yang_check_imports(struct lys_module *module, struct unres_schema *unres)
{
    struct lys_import *imp;
    struct lys_include *inc;
    uint8_t imp_size, inc_size, j = 0, i = 0;
    char *s;

    imp = module->imp;
    imp_size = module->imp_size;
    inc = module->inc;
    inc_size = module->inc_size;

    if (imp_size) {
        module->imp = calloc(imp_size, sizeof *module->imp);
        module->imp_size = 0;
        if (!module->imp) {
            LOGMEM;
            goto error;
        }
    }

    if (inc_size) {
        module->inc = calloc(inc_size, sizeof *module->inc);
        module->inc_size = 0;
        if (!module->inc) {
            LOGMEM;
            goto error;
        }
    }

    for (i = 0; i < imp_size; ++i) {
        s = (char *) imp[i].module;
        imp[i].module = NULL;
        if (yang_fill_import(module, &imp[i], &module->imp[module->imp_size], s, unres)) {
            ++i;
            goto error;
        }
    }
    for (j = 0; j < inc_size; ++j) {
        s = (char *) inc[j].submodule;
        inc[j].submodule = NULL;
        if (yang_fill_include(module, s, &inc[j], unres)) {
            ++j;
            goto error;
        }
    }
    free(inc);
    free(imp);

    return EXIT_SUCCESS;

error:
    yang_free_import(module->ctx, imp, i, imp_size);
    yang_free_include(module->ctx, inc, j, inc_size);
    free(imp);
    free(inc);
    return EXIT_FAILURE;
}